

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcls2(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp
           ,char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  char *pcVar1;
  int iVar2;
  uint in_ESI;
  int *in_RDI;
  size_t in_R8;
  int in_R9D;
  char *in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  undefined4 *in_stack_00000020;
  fitsfile *in_stack_00000028;
  char *arrayptr;
  char *buffer;
  double cbuff [3600];
  tcolumn *colptr;
  char snull [20];
  char message [81];
  char tform [20];
  double zero;
  double scale;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long jj;
  long ii;
  long incre;
  long twidth;
  int nulcheck;
  int hdutype;
  int maxelem;
  int tcode;
  long nullen;
  double dtemp;
  int *status_00;
  undefined1 *puVar3;
  long *nelem_00;
  fitsfile *fptr_00;
  long *status_01;
  long *buffer_00;
  undefined1 *offset;
  fitsfile *fptr_01;
  int *in_stack_ffffffffffff8d30;
  char *gsize;
  int *in_stack_ffffffffffff8d38;
  fitsfile *pfVar4;
  int in_stack_ffffffffffff8d44;
  fitsfile *in_stack_ffffffffffff8d48;
  size_t local_72b0;
  undefined8 in_stack_ffffffffffff8d90;
  LONGLONG in_stack_ffffffffffff8d98;
  LONGLONG in_stack_ffffffffffff8da0;
  LONGLONG in_stack_ffffffffffff8da8;
  undefined8 in_stack_ffffffffffff8db0;
  int colnum_00;
  fitsfile *in_stack_ffffffffffff8db8;
  char *pcVar5;
  undefined8 local_7240;
  double *in_stack_ffffffffffff8dd0;
  double *in_stack_ffffffffffff8dd8;
  char *in_stack_ffffffffffff8de0;
  long *in_stack_ffffffffffff8de8;
  int *in_stack_ffffffffffff8df0;
  int *in_stack_ffffffffffff8df8;
  LONGLONG *in_stack_ffffffffffff8e00;
  LONGLONG *in_stack_ffffffffffff8e08;
  long *in_stack_ffffffffffff8e10;
  LONGLONG *in_stack_ffffffffffff8e18;
  LONGLONG *in_stack_ffffffffffff8e20;
  int *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  char *in_stack_ffffffffffff8e38;
  int *in_stack_ffffffffffff8e40;
  char local_1a8 [32];
  char local_188 [96];
  undefined1 local_128 [32];
  int local_108 [4];
  long local_f8;
  size_t local_f0;
  long local_e8;
  long local_e0;
  fitsfile local_d8;
  long local_c8;
  long local_c0;
  long local_b8;
  size_t local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int local_88;
  undefined1 local_84 [4];
  int local_80;
  undefined1 local_7c [24];
  int local_64;
  size_t local_60;
  uint local_44;
  int *local_40;
  int local_34;
  
  colnum_00 = (int)((ulong)in_stack_ffffffffffff8db0 >> 0x20);
  iVar2 = (int)((ulong)in_stack_ffffffffffff8d90 >> 0x20);
  if ((in_stack_00000028->HDUposition < 1) && (in_R8 != 0)) {
    local_64 = in_R9D;
    local_60 = in_R8;
    local_44 = in_ESI;
    local_40 = in_RDI;
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffff8d48,in_stack_ffffffffffff8d44,in_stack_ffffffffffff8d38,
             in_stack_ffffffffffff8d30);
    }
    if (in_stack_00000020 != (undefined4 *)0x0) {
      *in_stack_00000020 = 0;
    }
    if (local_64 == 2) {
      memset(in_stack_00000018,0,local_60);
    }
    if (((int)local_44 < 1) || (*(int *)(*(long *)(local_40 + 2) + 0x3b0) < (int)local_44)) {
      snprintf(local_188,0x51,"Specified column number is out of range: %d",(ulong)local_44);
      ffpmsg((char *)0x1c00a5);
      in_stack_00000028->HDUposition = 0x12e;
      local_34 = 0x12e;
    }
    else {
      local_7c._0_4_ =
           *(int *)(*(long *)(*(long *)(local_40 + 2) + 0x3d0) + (long)(int)(local_44 - 1) * 0xa0 +
                   0x50);
      pfVar4 = in_stack_00000028;
      if (local_7c._0_4_ == -0x10) {
        puVar3 = local_128;
        gsize = local_1a8;
        status_00 = local_108;
        nelem_00 = &local_90;
        fptr_00 = (fitsfile *)local_7c;
        status_01 = &local_b8;
        buffer_00 = &local_e0;
        offset = local_84;
        fptr_01 = &local_d8;
        iVar2 = ffgcprll(in_stack_ffffffffffff8db8,(int)((ulong)in_stack_00000028 >> 0x20),
                         (LONGLONG)&local_80,(LONGLONG)fptr_00,(LONGLONG)nelem_00,
                         (int)((ulong)puVar3 >> 0x20),in_stack_ffffffffffff8dd0,
                         in_stack_ffffffffffff8dd8,in_stack_ffffffffffff8de0,
                         in_stack_ffffffffffff8de8,in_stack_ffffffffffff8df0,
                         in_stack_ffffffffffff8df8,in_stack_ffffffffffff8e00,
                         in_stack_ffffffffffff8e08,in_stack_ffffffffffff8e10,
                         in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,
                         in_stack_ffffffffffff8e28,in_stack_ffffffffffff8e30,
                         in_stack_ffffffffffff8e38,in_stack_ffffffffffff8e40);
        if (0 < iVar2) {
          return in_stack_00000028->HDUposition;
        }
        local_f0 = 1;
        local_90 = local_b8;
      }
      else {
        if (local_7c._0_4_ != 0x10) {
          in_stack_00000028->HDUposition = 0x135;
          return 0x135;
        }
        puVar3 = local_128;
        gsize = local_1a8;
        status_00 = local_108;
        nelem_00 = &local_90;
        fptr_00 = (fitsfile *)local_7c;
        status_01 = &local_b8;
        buffer_00 = &local_e0;
        offset = local_84;
        fptr_01 = &local_d8;
        iVar2 = ffgcprll(in_stack_ffffffffffff8db8,colnum_00,in_stack_ffffffffffff8da8,
                         in_stack_ffffffffffff8da0,in_stack_ffffffffffff8d98,iVar2,
                         in_stack_ffffffffffff8dd0,in_stack_ffffffffffff8dd8,
                         in_stack_ffffffffffff8de0,in_stack_ffffffffffff8de8,
                         in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8,
                         in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
                         in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,
                         in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,
                         in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,
                         in_stack_ffffffffffff8e40);
        if (0 < iVar2) {
          return in_stack_00000028->HDUposition;
        }
        if (0xb40 < local_90) {
          local_80 = 1;
          local_98 = local_90;
          local_b8 = 1;
        }
        local_f0 = local_60;
      }
      local_7c._4_8_ = strlen(local_1a8);
      if (local_7c._4_8_ == 0) {
        local_7c._4_8_ = 1;
      }
      local_88 = local_64;
      if ((local_64 == 1) && (in_stack_00000008 == (char *)0x0)) {
        local_88 = 0;
      }
      else if ((local_64 == 1) &&
              ((in_stack_00000008 != (char *)0x0 && (*in_stack_00000008 == '\0')))) {
        local_88 = 0;
      }
      else if (local_1a8[0] == '\x01') {
        local_88 = 0;
      }
      else if (local_90 < (long)local_7c._4_8_) {
        local_88 = 0;
      }
      local_f8 = 0;
      local_e8 = 0;
      while (local_f0 != 0) {
        if ((long)local_f0 < (long)local_80) {
          local_72b0 = local_f0;
        }
        else {
          local_72b0 = (size_t)local_80;
        }
        if (local_b8 - local_c8 <= (long)local_72b0) {
          local_72b0 = local_b8 - local_c8;
        }
        local_d8.Fptr = (FITSfile *)(local_c0 + local_e8 * local_e0 + local_c8 * local_98);
        local_b0 = local_72b0;
        ffmbyt(fptr_00,(LONGLONG)nelem_00,(int)((ulong)puVar3 >> 0x20),status_00);
        if (local_98 == local_90) {
          ffgbyt(fptr_01,(LONGLONG)offset,buffer_00,(int *)status_01);
        }
        else {
          ffgbytoff(pfVar4,(long)gsize,(long)fptr_01,(long)offset,buffer_00,(int *)status_01);
        }
        local_7240 = (char *)((long)&local_7240 + local_b0 * local_90 + 7);
        local_a0 = local_f8 + local_b0;
        while (local_a0 = local_a0 + -1, local_f8 <= local_a0) {
          pcVar1 = (char *)(*(long *)(in_stack_00000010 + local_a0 * 8) + local_90);
          local_a8 = local_90;
          while( true ) {
            local_a8 = local_a8 + -1;
            pcVar5 = pcVar1 + -1;
            if ((local_a8 < 1) || (*local_7240 != ' ')) break;
            local_7240 = local_7240 + -1;
            pcVar1 = pcVar5;
          }
          *pcVar1 = '\0';
          for (; -1 < local_a8; local_a8 = local_a8 + -1) {
            *pcVar5 = *local_7240;
            local_7240 = local_7240 + -1;
            pcVar5 = pcVar5 + -1;
          }
          if ((local_88 != 0) &&
             (iVar2 = strncmp(local_1a8,*(char **)(in_stack_00000010 + local_a0 * 8),local_7c._4_8_)
             , iVar2 == 0)) {
            *in_stack_00000020 = 1;
            if (local_64 == 1) {
              if (in_stack_00000008 == (char *)0x0) {
                strcpy(*(char **)(in_stack_00000010 + local_a0 * 8)," ");
              }
              else {
                strcpy(*(char **)(in_stack_00000010 + local_a0 * 8),in_stack_00000008);
              }
            }
            else {
              *(undefined1 *)((long)in_stack_00000018 + local_a0) = 1;
            }
          }
        }
        if (0 < in_stack_00000028->HDUposition) {
          local_7c._12_8_ = (undefined8)local_f8;
          snprintf(local_188,0x51,"Error reading elements %.0f thru %.0f of data array (ffpcls).",
                   (double)local_7c._12_8_ + 1.0,(double)local_7c._12_8_ + (double)(long)local_b0);
          ffpmsg((char *)0x1c0995);
          return in_stack_00000028->HDUposition;
        }
        local_f8 = local_b0 + local_f8;
        local_f0 = local_f0 - local_b0;
        if ((local_f0 != 0) && (local_c8 = local_b0 + local_c8, local_c8 == local_b8)) {
          local_c8 = 0;
          local_e8 = local_e8 + 1;
        }
      }
      local_34 = in_stack_00000028->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000028->HDUposition;
  }
  return local_34;
}

Assistant:

int ffgcls2 ( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
*/
{
    double dtemp;
    long nullen; 
    int tcode, maxelem, hdutype, nulcheck;
    long twidth, incre;
    long ii, jj, ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    tcolumn *colptr;

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    char *buffer, *arrayptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = colptr->tdatatype;

    if (tcode == -TSTRING) /* variable length column in a binary table? */
    {
      /* only read a single string; ignore value of firstelem */

      if (ffgcprll( fptr, colnum, firstrow, 1, 1, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      remain = 1;
      twidth = (long) repeat;  
    }
    else if (tcode == TSTRING)
    {
      if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      /* if string length is greater than a FITS block (2880 char) then must */
      /* only read 1 string at a time, to force reading by ffgbyt instead of */
      /* ffgbytoff (ffgbytoff can't handle this case) */
      if (twidth > IOBUFLEN) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }   

      remain = nelem;
    }
    else
        return(*status = NOT_ASCII_COL);

    nullen = strlen(snull);   /* length of the undefined pixel string */
    if (nullen == 0)
        nullen = 1;
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (nultyp == 1 && nulval && nulval[0] == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (snull[0] == ASCII_NULL_UNDEFINED)
       nulcheck = 0;   /* null value string in ASCII table not defined */

    else if (nullen > twidth)
       nulcheck = 0;   /* null value string is longer than width of column  */
                       /* thus impossible for any column elements to = null */

    /*---------------------------------------------------------------------*/
    /*  Now read the strings one at a time from the FITS column.           */
    /*---------------------------------------------------------------------*/
    next = 0;                 /* next element in array to be read  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      /* limit the number of pixels to process at one time to the number that
         will fit in the buffer space or to the number of pixels that remain
         in the current vector, which ever is smaller.
      */
      ntodo = (long) minvalue(remain, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);
      ffmbyt(fptr, readptr, REPORT_EOF, status);  /* move to read position */

      /* read the array of strings from the FITS file into the buffer */

      if (incre == twidth)
         ffgbyt(fptr, ntodo * twidth, cbuff, status);
      else
         ffgbytoff(fptr, twidth, ntodo, incre - twidth, cbuff, status);

      /* copy from the buffer into the user's array of strings */
      /* work backwards from last char of last string to 1st char of 1st */

      buffer = ((char *) cbuff) + (ntodo * twidth) - 1;

      for (ii = (long) (next + ntodo - 1); ii >= next; ii--)
      {
         arrayptr = array[ii] + twidth - 1;

         for (jj = twidth - 1; jj > 0; jj--)  /* ignore trailing blanks */
         {
            if (*buffer == ' ')
            {
              buffer--;
              arrayptr--;
            }
            else
              break;
         }
         *(arrayptr + 1) = 0;  /* write the string terminator */
         
         for (; jj >= 0; jj--)    /* copy the string itself */
         {
           *arrayptr = *buffer;
           buffer--;
           arrayptr--;
         }

         /* check if null value is defined, and if the   */
         /* column string is identical to the null string */
         if (nulcheck && !strncmp(snull, array[ii], nullen) )
         {
           *anynul = 1;   /* this is a null value */
           if (nultyp == 1) {
	   
	     if (nulval)
                strcpy(array[ii], nulval);
	     else
	        strcpy(array[ii], " ");
	     
           } else
             nularray[ii] = 1;
         }
      }
    
      if (*status > 0)  /* test for error during previous read operation */
      {
         dtemp = (double) next;
         snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thru %.0f of data array (ffpcls).",
             dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      next += ntodo;
      remain -= ntodo;
      if (remain)
      {
          elemnum += ntodo;
          if (elemnum == repeat)  /* completed a row; start on next row */
          {
              elemnum = 0;
              rownum++;
          }
      }
    }  /*  End of main while Loop  */

    return(*status);
}